

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall mjs::print_visitor::operator()(print_visitor *this,variable_statement *s)

{
  long *plVar1;
  undefined4 uVar2;
  undefined8 in_RAX;
  wostream *pwVar3;
  pointer pdVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::operator<<(this->os_,"var");
  pdVar4 = (s->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((s->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar4) {
    lVar6 = 0x20;
    uVar7 = 0;
    do {
      pcVar5 = ", ";
      if (uVar7 == 0) {
        pcVar5 = " ";
      }
      pwVar3 = std::operator<<(this->os_,pcVar5);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar3,*(wchar_t **)((long)pdVar4 + lVar6 + -0x20),
                 *(long *)((long)pdVar4 + lVar6 + -0x18));
      if (*(long *)((long)&(pdVar4->id_)._M_dataplus._M_p + lVar6) != 0) {
        std::operator<<(this->os_," = ");
        accept<mjs::print_visitor>
                  (*(expression **)((long)&(pdVar4->id_)._M_dataplus._M_p + lVar6),this);
      }
      uVar7 = uVar7 + 1;
      pdVar4 = (s->l_).super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x28;
    } while (uVar7 < (ulong)(((long)(s->l_).
                                    super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)
                            * -0x3333333333333333));
  }
  pwVar3 = this->os_;
  plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x3b);
    uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              (pwVar3,(wchar_t *)((long)&uStack_38 + 4),1);
    return;
  }
  std::__throw_bad_cast();
}

Assistant:

void operator()(const variable_statement& s) {
        os_ << "var";
        for (size_t i = 0; i < s.l().size(); ++i) {
            const auto& d = s.l()[i];
            os_ << (i ? ", ": " ") << d.id();
            if (d.init()) {
                os_ << " = ";
                accept(*d.init(), *this);
            }
        }
        os_ << ';';
    }